

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Performance::anon_unknown_1::
ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>::
logAndSetTestResult(ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                    *this,vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                          *results)

{
  TestContext *this_00;
  int precision;
  UploadSampleAnalyzeResult UVar1;
  string local_30;
  
  UVar1 = analyzeSampleResults<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                    (((this->
                      super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                      ).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log,results,false
                    );
  this_00 = (this->
            super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
            ).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
  if (UVar1.transferRateMedian < INFINITY) {
    de::floatToString_abi_cxx11_
              (&local_30,(de *)0x2,UVar1.transferRateMedian * 0.0009765625 * 0.0009765625,precision)
    ;
    tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,local_30._M_dataplus._M_p);
  }
  else {
    de::floatToString_abi_cxx11_(&local_30,(de *)0x2,0.0,precision);
    tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,local_30._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void ModifyAfterBasicCase<SampleType>::logAndSetTestResult (const std::vector<UploadSampleResult<SampleType> >& results)
{
	const UploadSampleAnalyzeResult analysis = analyzeSampleResults(m_testCtx.getLog(), results, false);

	// Return median transfer rate of the samples

	if (analysis.transferRateMedian == std::numeric_limits<float>::infinity())
	{
		// sample times are 1) invalid or 2) timer resolution too low
		// report speed 0 bytes / s since real value cannot be determined
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, de::floatToString(0.0f, 2).c_str());
	}
	else
	{
		// report transfer rate in MB / s
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, de::floatToString(analysis.transferRateMedian / 1024.0f / 1024.0f, 2).c_str());
	}
}